

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Bitmask sqlite3ExprColUsed(Expr *pExpr)

{
  Table *pTVar1;
  Expr *local_30;
  Table *pExTab;
  int n;
  Expr *pExpr_local;
  
  pExTab._4_4_ = (int)pExpr->iColumn;
  pTVar1 = (pExpr->y).pTab;
  if (((pTVar1->tabFlags & 0x60) == 0) || ((pTVar1->aCol[pExTab._4_4_].colFlags & 0x60) == 0)) {
    if (0x3f < pExTab._4_4_) {
      pExTab._4_4_ = 0x3f;
    }
    pExpr_local = (Expr *)(1L << ((byte)pExTab._4_4_ & 0x3f));
  }
  else {
    if (pTVar1->nCol < 0x40) {
      local_30 = (Expr *)((1L << ((byte)pTVar1->nCol & 0x3f)) + -1);
    }
    else {
      local_30 = (Expr *)0xffffffffffffffff;
    }
    pExpr_local = local_30;
  }
  return (Bitmask)pExpr_local;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3ExprColUsed(Expr *pExpr){
  int n;
  Table *pExTab;

  n = pExpr->iColumn;
  assert( ExprUseYTab(pExpr) );
  pExTab = pExpr->y.pTab;
  assert( pExTab!=0 );
  assert( n < pExTab->nCol );
  if( (pExTab->tabFlags & TF_HasGenerated)!=0
   && (pExTab->aCol[n].colFlags & COLFLAG_GENERATED)!=0
  ){
    testcase( pExTab->nCol==BMS-1 );
    testcase( pExTab->nCol==BMS );
    return pExTab->nCol>=BMS ? ALLBITS : MASKBIT(pExTab->nCol)-1;
  }else{
    testcase( n==BMS-1 );
    testcase( n==BMS );
    if( n>=BMS ) n = BMS-1;
    return ((Bitmask)1)<<n;
  }
}